

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::btSoftBody
          (btSoftBody *this,btSoftBodyWorldInfo *worldInfo,int node_count,btVector3 *x,btScalar *m)

{
  btVector3 *pbVar1;
  btCollisionShape *pbVar2;
  Node *pNVar3;
  btScalar *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  btCollisionObject *in_RDI;
  btScalar *in_R8;
  float fVar4;
  Node *n;
  int ni;
  int i;
  btScalar margin;
  Material *pm;
  Node *in_stack_fffffffffffffdf0;
  btDbvtVolume *volume;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  btScalar bVar5;
  undefined8 in_stack_fffffffffffffe08;
  int newsize;
  btScalar r;
  Pose *in_stack_fffffffffffffe10;
  btAlignedObjectArray<btSoftBody::Node> *this_00;
  btCollisionObject *in_stack_fffffffffffffe20;
  btSoftBody *this_01;
  btSoftBody *this_02;
  btScalar local_f4;
  btScalar local_f0;
  btScalar local_ec;
  btVector3 local_e8;
  Node *local_d8;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Material *local_40;
  btScalar *local_28;
  btScalar *local_20;
  int local_14;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  btCollisionObject::btCollisionObject(in_stack_fffffffffffffe20);
  in_RDI->_vptr_btCollisionObject = (_func_int **)&PTR__btSoftBody_002e8250;
  btAlignedObjectArray<const_btCollisionObject_*>::btAlignedObjectArray
            ((btAlignedObjectArray<const_btCollisionObject_*> *)in_stack_fffffffffffffdf0);
  pbVar1 = in_RDI[1].m_worldTransform.m_basis.m_el;
  pbVar1[1].m_floats[2] = 0.0;
  pbVar1[1].m_floats[3] = 0.0;
  Config::Config((Config *)in_stack_fffffffffffffe10);
  Pose::Pose(in_stack_fffffffffffffe10);
  *(undefined8 *)in_RDI[2].m_anisotropicFriction.m_floats = local_10;
  btAlignedObjectArray<btSoftBody::Note>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Note> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Node>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Node> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Link>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Link> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Face>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Face> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Tetra>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Tetra> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Anchor>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Anchor> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::RContact>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::RContact> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::SContact>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::SContact> *)in_stack_fffffffffffffdf0);
  this_02 = (btSoftBody *)(in_RDI[3].m_interpolationWorldTransform.m_basis.m_el[1].m_floats + 2);
  btAlignedObjectArray<btSoftBody::Joint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Joint_*> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Material_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Material_*> *)in_stack_fffffffffffffdf0);
  this_01 = (btSoftBody *)(in_RDI[3].m_interpolationAngularVelocity.m_floats + 3);
  do {
    btVector3::btVector3((btVector3 *)this_01);
    newsize = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    this_01 = (btSoftBody *)
              ((this_01->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
  } while (this_01 != (btSoftBody *)((long)&in_RDI[3].m_broadphaseHandle + 4));
  btDbvt::btDbvt((btDbvt *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  btDbvt::btDbvt((btDbvt *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  btDbvt::btDbvt((btDbvt *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  btAlignedObjectArray<btSoftBody::Cluster_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)in_stack_fffffffffffffdf0);
  btAlignedObjectArray<bool>::btAlignedObjectArray
            ((btAlignedObjectArray<bool> *)in_stack_fffffffffffffdf0);
  btTransform::btTransform((btTransform *)in_stack_fffffffffffffdf0);
  btVector3::btVector3((btVector3 *)&in_RDI[4].m_ccdSweptSphereRadius);
  btAlignedObjectArray<int>::btAlignedObjectArray
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffffdf0);
  initDefaults(this_01);
  local_40 = appendMaterial((btSoftBody *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_40->m_kLST = 1.0;
  local_40->m_kAST = 1.0;
  local_40->m_kVST = 1.0;
  local_40->m_flags = 1;
  pbVar2 = btCollisionObject::getCollisionShape(in_RDI);
  (*pbVar2->_vptr_btCollisionShape[0xc])();
  this_00 = (btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_58 = 0;
  Node::Node(in_stack_fffffffffffffdf0);
  btAlignedObjectArray<btSoftBody::Node>::resize
            (this_00,newsize,(Node *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_d0 = local_14;
  for (local_cc = 0; local_cc < local_d0; local_cc = local_cc + 1) {
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer,
                        local_cc);
    local_d8 = pNVar3;
    ZeroInitialize<btSoftBody::Node>((Node *)0x2673cc);
    r = (btScalar)((ulong)pNVar3 >> 0x20);
    if (local_20 == (btScalar *)0x0) {
      local_ec = 0.0;
      local_f0 = 0.0;
      local_f4 = 0.0;
      btVector3::btVector3(&local_e8,&local_ec,&local_f0,&local_f4);
    }
    else {
      local_e8.m_floats._0_8_ = *(undefined8 *)local_20;
      local_e8.m_floats._8_8_ = *(undefined8 *)(local_20 + 2);
      local_20 = local_20 + 4;
    }
    *(undefined8 *)(local_d8->m_x).m_floats = local_e8.m_floats._0_8_;
    *(undefined8 *)((local_d8->m_x).m_floats + 2) = local_e8.m_floats._8_8_;
    *(undefined8 *)(local_d8->m_q).m_floats = *(undefined8 *)(local_d8->m_x).m_floats;
    *(undefined8 *)((local_d8->m_q).m_floats + 2) = *(undefined8 *)((local_d8->m_x).m_floats + 2);
    if (local_28 == (btScalar *)0x0) {
      bVar5 = 1.0;
    }
    else {
      bVar5 = *local_28;
      local_28 = local_28 + 1;
    }
    local_d8->m_im = bVar5;
    if (local_d8->m_im <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = 1.0 / local_d8->m_im;
    }
    local_d8->m_im = fVar4;
    volume = (btDbvtVolume *)&in_RDI[3].m_collisionShape;
    btDbvtAabbMm::FromCR((btVector3 *)this_00,r);
    in_stack_fffffffffffffdf0 =
         (Node *)btDbvt::insert((btDbvt *)CONCAT44(bVar5,fVar4),volume,in_stack_fffffffffffffdf0);
    local_d8->m_leaf = (btDbvtNode *)in_stack_fffffffffffffdf0;
    (local_d8->super_Feature).m_material = local_40;
  }
  updateBounds(this_02);
  return;
}

Assistant:

btSoftBody::btSoftBody(btSoftBodyWorldInfo*	worldInfo,int node_count,  const btVector3* x,  const btScalar* m)
:m_softBodySolver(0),m_worldInfo(worldInfo)
{	
	/* Init		*/ 
	initDefaults();

	/* Default material	*/ 
	Material*	pm=appendMaterial();
	pm->m_kLST	=	1;
	pm->m_kAST	=	1;
	pm->m_kVST	=	1;
	pm->m_flags	=	fMaterial::Default;

	/* Nodes			*/ 
	const btScalar		margin=getCollisionShape()->getMargin();
	m_nodes.resize(node_count);
	for(int i=0,ni=node_count;i<ni;++i)
	{	
		Node&	n=m_nodes[i];
		ZeroInitialize(n);
		n.m_x		=	x?*x++:btVector3(0,0,0);
		n.m_q		=	n.m_x;
		n.m_im		=	m?*m++:1;
		n.m_im		=	n.m_im>0?1/n.m_im:0;
		n.m_leaf	=	m_ndbvt.insert(btDbvtVolume::FromCR(n.m_x,margin),&n);
		n.m_material=	pm;
	}
	updateBounds();	

}